

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absGlaOld.c
# Opt level: O1

void Gla_ManCollect(Gla_Man_t *p,Vec_Int_t *vPis,Vec_Int_t *vPPis,Vec_Int_t *vCos,Vec_Int_t *vRoAnds
                   )

{
  int iVar1;
  Gia_Man_t *pGVar2;
  int *piVar3;
  Gia_Obj_t *pGVar4;
  int *piVar5;
  int iVar6;
  Vec_Int_t *pVVar7;
  Gla_Obj_t *pGVar8;
  Gia_Obj_t *pGVar9;
  uint uVar10;
  Gla_Obj_t *pGVar11;
  long lVar12;
  long lVar13;
  ulong uVar14;
  
  pGVar2 = p->pGia;
  iVar6 = pGVar2->vCos->nSize;
  if (iVar6 <= pGVar2->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (iVar6 < 1) {
LAB_0055e03a:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar6 = *pGVar2->vCos->pArray;
  if ((-1 < iVar6) && (iVar6 < pGVar2->nObjs)) {
    Vec_IntPush(vCos,iVar6);
    pVVar7 = p->vAbs;
    if (0 < pVVar7->nSize) {
      lVar12 = 0;
      do {
        iVar6 = pVVar7->pArray[lVar12];
        if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_0055df80:
          __assert_fail("i >= 0 && i < p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                        ,0x6e,"Gla_Obj_t *Gla_ManObj(Gla_Man_t *, int)");
        }
        if (iVar6 == 0) {
          pGVar11 = (Gla_Obj_t *)0x0;
        }
        else {
          pGVar11 = p->pObjs + iVar6;
        }
        if ((*(uint *)&pGVar11->field_0x4 & 0xa4) == 0) {
          __assert_fail("pObj->fConst || pObj->fRo || pObj->fAnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/proof/abs/absGlaOld.c"
                        ,0xf0,
                        "void Gla_ManCollect(Gla_Man_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        if ((*(uint *)&pGVar11->field_0x4 & 0x20) != 0) {
          iVar6 = pGVar11->iGiaObj;
          if ((long)iVar6 < 0) goto LAB_0055df9f;
          pGVar2 = p->pGia;
          if (pGVar2->nObjs <= iVar6) goto LAB_0055df9f;
          if ((~(uint)*(undefined8 *)(pGVar2->pObjs + iVar6) & 0x9fffffff) != 0) {
LAB_0055dffc:
            __assert_fail("Gia_ObjIsRo(p, pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                          ,0x1cf,"Gia_Obj_t *Gia_ObjRoToRi(Gia_Man_t *, Gia_Obj_t *)");
          }
          uVar10 = (uint)((ulong)*(undefined8 *)(pGVar2->pObjs + iVar6) >> 0x20) & 0x1fffffff;
          iVar6 = pGVar2->vCis->nSize;
          if ((int)uVar10 < iVar6 - pGVar2->nRegs) goto LAB_0055dffc;
          iVar1 = pGVar2->vCos->nSize;
          uVar10 = (iVar1 - iVar6) + uVar10;
          if (((int)uVar10 < 0) || (iVar1 <= (int)uVar10)) goto LAB_0055e03a;
          iVar6 = pGVar2->vCos->pArray[uVar10];
          if ((iVar6 < 0) || (pGVar2->nObjs <= iVar6)) goto LAB_0055df9f;
          Vec_IntPush(vCos,iVar6);
        }
        if (0x1ff < *(uint *)&pGVar11->field_0x4) {
          uVar14 = 0;
          do {
            iVar6 = pGVar11->Fanins[uVar14];
            if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_0055df80;
            if (iVar6 == 0) {
              pGVar8 = (Gla_Obj_t *)0x0;
            }
            else {
              pGVar8 = p->pObjs + iVar6;
            }
            if ((*(uint *)&pGVar8->field_0x4 & 1) == 0) {
              pVVar7 = vPPis;
              if ((*(uint *)&pGVar8->field_0x4 & 8) != 0) {
                pVVar7 = vPis;
              }
              Vec_IntPush(pVVar7,pGVar8->iGiaObj);
            }
            uVar14 = uVar14 + 1;
          } while (uVar14 < *(uint *)&pGVar11->field_0x4 >> 9);
        }
        lVar12 = lVar12 + 1;
        pVVar7 = p->vAbs;
      } while (lVar12 < pVVar7->nSize);
    }
    if (1 < (long)vPis->nSize) {
      qsort(vPis->pArray,(long)vPis->nSize,4,Vec_IntSortCompare1);
      iVar6 = 1;
      if (1 < vPis->nSize) {
        piVar3 = vPis->pArray;
        lVar12 = 1;
        do {
          if (piVar3[lVar12] != piVar3[lVar12 + -1]) {
            lVar13 = (long)iVar6;
            iVar6 = iVar6 + 1;
            piVar3[lVar13] = piVar3[lVar12];
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vPis->nSize);
      }
      vPis->nSize = iVar6;
    }
    if (1 < (long)vPPis->nSize) {
      qsort(vPPis->pArray,(long)vPPis->nSize,4,Vec_IntSortCompare1);
      iVar6 = 1;
      if (1 < vPPis->nSize) {
        piVar3 = vPPis->pArray;
        lVar12 = 1;
        do {
          if (piVar3[lVar12] != piVar3[lVar12 + -1]) {
            lVar13 = (long)iVar6;
            iVar6 = iVar6 + 1;
            piVar3[lVar13] = piVar3[lVar12];
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < vPPis->nSize);
      }
      vPPis->nSize = iVar6;
    }
    qsort(vCos->pArray,(long)vCos->nSize,4,Vec_IntSortCompare1);
    Gia_ManIncrementTravId(p->pGia);
    pGVar2 = p->pGia;
    if (pGVar2->nObjs < 1) {
LAB_0055e01b:
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    if (pGVar2->nTravIdsAlloc < 1) {
LAB_0055dfbe:
      __assert_fail("Gia_ObjId(p, pObj) < p->nTravIdsAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                    ,0x227,"void Gia_ObjSetTravIdCurrent(Gia_Man_t *, Gia_Obj_t *)");
    }
    pGVar4 = pGVar2->pObjs;
    piVar3 = pGVar2->pTravIds;
    *piVar3 = pGVar2->nTravIds;
    if (0 < vPis->nSize) {
      piVar5 = vPis->pArray;
      lVar12 = 0;
      do {
        iVar6 = piVar5[lVar12];
        if (((long)iVar6 < 0) || (pGVar2->nObjs <= iVar6)) goto LAB_0055df9f;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        if (pGVar2->nTravIdsAlloc <= iVar6) goto LAB_0055dfbe;
        piVar3[iVar6] = pGVar2->nTravIds;
        lVar12 = lVar12 + 1;
      } while (lVar12 < vPis->nSize);
    }
    if (0 < vPPis->nSize) {
      piVar5 = vPPis->pArray;
      lVar12 = 0;
      do {
        iVar6 = piVar5[lVar12];
        if (((long)iVar6 < 0) || (pGVar2->nObjs <= iVar6)) goto LAB_0055df9f;
        if (pGVar4 == (Gia_Obj_t *)0x0) break;
        if (pGVar2->nTravIdsAlloc <= iVar6) goto LAB_0055dfbe;
        piVar3[iVar6] = pGVar2->nTravIds;
        lVar12 = lVar12 + 1;
      } while (lVar12 < vPPis->nSize);
    }
    if (0 < vCos->nSize) {
      lVar12 = 0;
      do {
        iVar6 = vCos->pArray[lVar12];
        if (((long)iVar6 < 0) || (pGVar2 = p->pGia, pGVar2->nObjs <= iVar6)) goto LAB_0055df9f;
        if (pGVar2->pObjs == (Gia_Obj_t *)0x0) break;
        if (lVar12 != 0) {
          pGVar9 = Gia_ObjRiToRo(pGVar2,pGVar2->pObjs + iVar6);
          pGVar2 = p->pGia;
          pGVar4 = pGVar2->pObjs;
          if ((pGVar9 < pGVar4) || (pGVar4 + pGVar2->nObjs <= pGVar9)) goto LAB_0055e01b;
          iVar6 = (int)((long)pGVar9 - (long)pGVar4 >> 2) * -0x55555555;
          if (pGVar2->nTravIdsAlloc <= iVar6) goto LAB_0055dfbe;
          pGVar2->pTravIds[iVar6] = pGVar2->nTravIds;
          if (pGVar4 + pGVar2->nObjs <= pGVar9) goto LAB_0055e01b;
          Vec_IntPush(vRoAnds,iVar6);
        }
        lVar12 = lVar12 + 1;
      } while (lVar12 < vCos->nSize);
    }
    if (0 < vCos->nSize) {
      lVar12 = 0;
      do {
        iVar6 = vCos->pArray[lVar12];
        if (((long)iVar6 < 0) || (pGVar2 = p->pGia, pGVar2->nObjs <= iVar6)) goto LAB_0055df9f;
        if (pGVar2->pObjs == (Gia_Obj_t *)0x0) {
          return;
        }
        pGVar4 = pGVar2->pObjs + iVar6;
        Gla_ManCollectInternal_rec
                  (pGVar2,pGVar4 + -(ulong)((uint)*(undefined8 *)pGVar4 & 0x1fffffff),vRoAnds);
        lVar12 = lVar12 + 1;
      } while (lVar12 < vCos->nSize);
    }
    return;
  }
LAB_0055df9f:
  __assert_fail("v >= 0 && v < p->nObjs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
}

Assistant:

void Gla_ManCollect( Gla_Man_t * p, Vec_Int_t * vPis, Vec_Int_t * vPPis, Vec_Int_t * vCos, Vec_Int_t * vRoAnds )
{
    Gla_Obj_t * pObj, * pFanin; 
    Gia_Obj_t * pGiaObj;
    int i, k;

    // collect COs
    Vec_IntPush( vCos, Gia_ObjId(p->pGia, Gia_ManPo(p->pGia, 0)) );
    // collect fanins of abstracted objects
    Gla_ManForEachObjAbs( p, pObj, i )
    {
        assert( pObj->fConst || pObj->fRo || pObj->fAnd );
        if ( pObj->fRo )
        {
            pGiaObj = Gia_ObjRoToRi( p->pGia, Gia_ManObj(p->pGia, pObj->iGiaObj) );
            Vec_IntPush( vCos, Gia_ObjId(p->pGia, pGiaObj) );
        }
        Gla_ObjForEachFanin( p, pObj, pFanin, k )
            if ( !pFanin->fAbs )
                Vec_IntPush( (pFanin->fPi ? vPis : vPPis), pFanin->iGiaObj );
    }
    Vec_IntUniqify( vPis );
    Vec_IntUniqify( vPPis );
    Vec_IntSort( vCos, 0 );
    // sorting PIs/PPIs/COs leads to refinements that are more "well-aligned"...

    // mark const/PIs/PPIs
    Gia_ManIncrementTravId( p->pGia );
    Gia_ObjSetTravIdCurrent( p->pGia, Gia_ManConst0(p->pGia) );
    Gia_ManForEachObjVec( vPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    Gia_ManForEachObjVec( vPPis, p->pGia, pGiaObj, i )
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
    // mark and add ROs first
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
    {
        if ( i == 0 ) continue;
        pGiaObj = Gia_ObjRiToRo( p->pGia, pGiaObj );
        Gia_ObjSetTravIdCurrent( p->pGia, pGiaObj );
        Vec_IntPush( vRoAnds, Gia_ObjId(p->pGia, pGiaObj) );
    }
    // collect nodes between PIs/PPIs/ROs and COs
    Gia_ManForEachObjVec( vCos, p->pGia, pGiaObj, i )
        Gla_ManCollectInternal_rec( p->pGia, Gia_ObjFanin0(pGiaObj), vRoAnds );
}